

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O2

void ParseSm24(SFFile *sf2,FileReader *f,DWORD chunkid,DWORD chunklen)

{
  DWORD DVar1;
  
  if ((3 < sf2->MinorVersion) && (sf2->SampleDataLSBOffset == 0)) {
    DVar1 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[3])(f);
    sf2->SampleDataLSBOffset = DVar1;
    sf2->SizeSampleDataLSB = chunklen;
  }
  skip_chunk(f,chunklen);
  return;
}

Assistant:

static void ParseSm24(SFFile *sf2, FileReader *f, DWORD chunkid, DWORD chunklen)
{
	// The sm24 chunk is ignored if the file version is < 2.04
	if (sf2->MinorVersion >= 4)
	{
		// Only use the first sm24 chunk. (Or should we reject files with more than one?)
		if (sf2->SampleDataLSBOffset == 0)
		{
			sf2->SampleDataLSBOffset = f->Tell();
			sf2->SizeSampleDataLSB = chunklen;
		}
	}
	skip_chunk(f, chunklen);
}